

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo _lineInfo;
  bool bVar1;
  string *msg;
  undefined8 in_RSI;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var2;
  undefined7 in_stack_fffffffffffffdb8;
  char in_stack_fffffffffffffdbf;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  *in_stack_fffffffffffffdc0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  *in_stack_fffffffffffffdc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  ReusableStringStream *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  bool local_19a;
  allocator<char> local_41;
  string local_40 [48];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)in_stack_fffffffffffffdf0);
  bVar1 = startsWith(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_19a = false;
  if (bVar1) {
    local_19a = endsWith(&in_stack_fffffffffffffdc0->first,in_stack_fffffffffffffdbf);
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((local_19a ^ 0xffU) & 1) != 0) {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffdf0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [20])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [37])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8)
              );
    throw_domain_error(in_stack_fffffffffffffde0);
  }
  _lineInfo.line = (size_t)in_stack_fffffffffffffdd0;
  _lineInfo.file = (char *)in_stack_fffffffffffffdc8;
  TagAlias::TagAlias((TagAlias *)in_stack_fffffffffffffdc0,
                     (string *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                     _lineInfo);
  std::make_pair<std::__cxx11::string_const&,Catch::TagAlias>
            (&in_stack_fffffffffffffdc8->first,(TagAlias *)in_stack_fffffffffffffdc0);
  _Var2 = std::
          map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::insert<std::pair<std::__cxx11::string,Catch::TagAlias>>
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  clara::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  ::~pair(in_stack_fffffffffffffdc0);
  TagAlias::~TagAlias((TagAlias *)0x1304db);
  if (((_Var2.second ^ 0xffU) & 1) != 0) {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffdf0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [20])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [23])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [17])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    msg = (string *)(**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [2])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [16])CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8)
              );
    throw_domain_error(msg);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }